

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,int64_t rows,int64_t cols,complex<float> *buf,
          int64_t sz)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  complex<float> *this_00;
  undefined8 in_RCX;
  complex<float> *pcVar4;
  long in_RDX;
  long in_RSI;
  TPZRegisterClassId *in_RDI;
  long in_R8;
  int64_t size;
  char *in_stack_00000128;
  char *in_stack_00000130;
  int64_t in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  ulong uVar5;
  void **in_stack_ffffffffffffff88;
  TPZManVector<int,_5> *in_stack_ffffffffffffff90;
  complex<float> *pcVar6;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de238;
  *(undefined8 *)(in_RDI + 0x20) = in_RCX;
  *(undefined8 *)(in_RDI + 0x28) = in_RCX;
  *(long *)(in_RDI + 0x30) = in_R8;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x70));
  uVar2 = in_RSI * in_RDX;
  if (uVar2 == 0) {
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  else if (in_R8 < (long)uVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar5 = uVar2;
    this_00 = (complex<float> *)operator_new__(uVar3);
    pcVar6 = this_00;
    if (uVar5 != 0) {
      pcVar4 = this_00 + uVar5;
      do {
        std::complex<float>::complex(this_00,0.0,0.0);
        this_00 = this_00 + 1;
      } while (this_00 != pcVar4);
    }
    *(complex<float> **)(in_RDI + 0x20) = pcVar6;
    if ((*(long *)(in_RDI + 0x20) == 0) && (uVar2 != 0)) {
      Error(in_stack_00000130,in_stack_00000128);
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,TVar * buf,const int64_t sz)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),TPZMatrix<TVar>( rows, cols ), 
fElem(buf),fGiven(buf),fSize(sz) {
    int64_t size = rows * cols;
    if(size == 0)
    {
        fElem = NULL;
    }
    else if(size > sz)
    {
        fElem=new TVar[size];
#ifndef PZNODEBUG
        if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    }
}